

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastaTest_CompressedFormatError_Test::
~BioparserFastaTest_CompressedFormatError_Test(BioparserFastaTest_CompressedFormatError_Test *this)

{
  BioparserFastaTest::~BioparserFastaTest(&this->super_BioparserFastaTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedFormatError) {
  Setup("sample.fastq.gz");
  try {
    s = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::FastaParser] error: invalid file format");
  }
}